

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O1

ParsedExtensionMetaData *
duckdb::ExtensionHelper::ParseExtensionMetaData
          (ParsedExtensionMetaData *__return_storage_ptr__,FileHandle *handle)

{
  pointer pcVar1;
  char *buffer;
  idx_t nr_bytes;
  idx_t iVar2;
  InvalidInputException *this;
  string metadata_segment;
  string engine_platform;
  string engine_version;
  char *local_d0;
  idx_t local_c8;
  char local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 *local_70;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  GetVersionDirectoryName_abi_cxx11_();
  DuckDB::Platform_abi_cxx11_();
  local_c8 = 0;
  local_c0[0] = '\0';
  local_d0 = local_c0;
  ::std::__cxx11::string::resize((ulong)&local_d0,'\0');
  iVar2 = FileHandle::GetFileSize(handle);
  nr_bytes = local_c8;
  buffer = local_d0;
  if (0x1ff < iVar2) {
    iVar2 = FileHandle::GetFileSize(handle);
    FileHandle::Read(handle,buffer,nr_bytes,iVar2 - 0x200);
    ParseExtensionMetaData(__return_storage_ptr__,local_d0);
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return __return_storage_ptr__;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "File \'%s\' is not a DuckDB extension. Valid DuckDB extensions must be at least %llu bytes"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (handle->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (handle->path)._M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string,unsigned_long>
            (this,&local_90,&local_b0,0x200);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ParsedExtensionMetaData ExtensionHelper::ParseExtensionMetaData(FileHandle &handle) {
	const string engine_version = string(ExtensionHelper::GetVersionDirectoryName());
	const string engine_platform = string(DuckDB::Platform());

	string metadata_segment;
	metadata_segment.resize(ParsedExtensionMetaData::FOOTER_SIZE);

	if (handle.GetFileSize() < ParsedExtensionMetaData::FOOTER_SIZE) {
		throw InvalidInputException(
		    "File '%s' is not a DuckDB extension. Valid DuckDB extensions must be at least %llu bytes", handle.path,
		    ParsedExtensionMetaData::FOOTER_SIZE);
	}

	handle.Read((void *)metadata_segment.data(), metadata_segment.size(),
	            handle.GetFileSize() - ParsedExtensionMetaData::FOOTER_SIZE);

	return ParseExtensionMetaData(metadata_segment.data());
}